

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Demiter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  Gia_Man_t *pPart2;
  Gia_Man_t *pPart1;
  char pName1 [1000];
  char pName0 [1000];
  uint local_824;
  Gia_Man_t *local_820;
  Gia_Man_t *local_818;
  Abc_Frame_t *local_810;
  char local_808 [1008];
  char local_418 [1000];
  
  bVar7 = false;
  Extra_UtilGetoptReset();
  iVar3 = Extra_UtilGetopt(argc,argv,"ftdvh");
  if (iVar3 == -1) {
    bVar2 = true;
    bVar1 = false;
    local_824 = 0;
  }
  else {
    local_824 = 0;
    bVar2 = false;
    bVar1 = false;
    bVar7 = false;
    local_810 = pAbc;
    do {
      switch(iVar3 - 100U >> 1 | (uint)((iVar3 - 100U & 1) != 0) << 0x1f) {
      case 0:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 1:
        bVar7 = (bool)(bVar7 ^ 1);
        break;
      default:
        Abc_Print(-2,"usage: &demiter [-ftdvh]\n");
        Abc_Print(-2,"\t         decomposes a miter (by default, tries to extract an OR gate)\n");
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (!bVar7) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-f     : write files with two sides of a dual-output miter [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-t     : write files with two sides of a two-word miter [default = %s]\n",
                  pcVar5);
        pcVar5 = "yes";
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-d     : take single-output and decompose into dual-output [default = %s]\n"
                  ,pcVar5);
        if (local_824 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar6);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      case 8:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 9:
        local_824 = local_824 ^ 1;
      }
      iVar3 = Extra_UtilGetopt(argc,argv,"ftdvh");
    } while (iVar3 != -1);
    bVar7 = bVar7 || bVar1;
    bVar2 = !bVar2;
    pAbc = local_810;
  }
  pGVar4 = pAbc->pGia;
  if (pGVar4 == (Gia_Man_t *)0x0) {
    pcVar5 = "Abc_CommandAbc9Demiter(): There is no AIG.\n";
  }
  else {
    if (bVar7) {
      memcpy(local_418,"miter_part0.aig",1000);
      memcpy(local_808,"miter_part1.aig",1000);
      if ((pGVar4->vCos->nSize - pGVar4->nRegs & 1U) == 0) {
        if (bVar1) {
          Gia_ManDemiterTwoWords(pGVar4,&local_818,&local_820);
        }
        else {
          Gia_ManDemiterDual(pGVar4,&local_818,&local_820);
        }
        pcVar5 = pAbc->pGia->pSpec;
        if (pcVar5 != (char *)0x0) {
          pcVar5 = Extra_FileNameGeneric(pcVar5);
          sprintf(local_418,"%s_1.aig",pcVar5);
          sprintf(local_808,"%s_2.aig",pcVar5);
          if (pcVar5 != (char *)0x0) {
            free(pcVar5);
          }
        }
        Gia_AigerWrite(local_818,local_418,0,0,0);
        Gia_AigerWrite(local_820,local_808,0,0,0);
        Gia_ManStop(local_818);
        Gia_ManStop(local_820);
        if (bVar1) {
          pcVar5 = "Two parts of the two-word miter are dumped into files \"%s\" and \"%s\".\n";
        }
        else {
          pcVar5 = "Two parts of the dual-output miter are dumped into files \"%s\" and \"%s\".\n";
        }
        printf(pcVar5,local_418,local_808);
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9Demiter(): Does not look like a dual-output miter.\n");
      return 0;
    }
    if (pGVar4->vCos->nSize - pGVar4->nRegs == 1) {
      if (bVar2) {
        pGVar4 = Gia_ManDupDemiter(pGVar4,local_824);
      }
      else {
        pGVar4 = Gia_ManDemiterToDual(pGVar4);
      }
      Abc_FrameUpdateGia(pAbc,pGVar4);
      if (local_824 == 0) {
        return 0;
      }
      Gia_ManPrintStatsMiter(pGVar4,0);
      return 0;
    }
    pcVar5 = "Abc_CommandAbc9Demiter(): Miter should have one output.\n";
  }
  Abc_Print(-1,pcVar5);
  return 0;
}

Assistant:

int Abc_CommandAbc9Demiter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fDumpFiles = 0, fDumpFilesTwo = 0, fDual = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ftdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fDumpFiles ^= 1;
            break;
        case 't':
            fDumpFilesTwo ^= 1;
            break;
        case 'd':
            fDual ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Demiter(): There is no AIG.\n" );
        return 0;
    }
    if ( fDumpFiles || fDumpFilesTwo )
    {
        char pName0[1000] = "miter_part0.aig";
        char pName1[1000] = "miter_part1.aig";
        Gia_Man_t * pPart1, * pPart2;
        if ( Gia_ManPoNum(pAbc->pGia) % 2 != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Demiter(): Does not look like a dual-output miter.\n" );
            return 0;
        }
        if ( fDumpFilesTwo )
            Gia_ManDemiterTwoWords( pAbc->pGia, &pPart1, &pPart2 );
        else
            Gia_ManDemiterDual( pAbc->pGia, &pPart1, &pPart2 );
        if ( pAbc->pGia->pSpec )
        {
            char * pGen = Extra_FileNameGeneric(pAbc->pGia->pSpec);
            sprintf( pName0, "%s_1.aig", pGen );
            sprintf( pName1, "%s_2.aig", pGen );
            ABC_FREE( pGen );
        }
        Gia_AigerWrite( pPart1, pName0, 0, 0, 0 );
        Gia_AigerWrite( pPart2, pName1, 0, 0, 0 );
        Gia_ManStop( pPart1 );
        Gia_ManStop( pPart2 );
        if ( fDumpFilesTwo )
            printf( "Two parts of the two-word miter are dumped into files \"%s\" and \"%s\".\n", pName0, pName1 );
        else
            printf( "Two parts of the dual-output miter are dumped into files \"%s\" and \"%s\".\n", pName0, pName1 );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Demiter(): Miter should have one output.\n" );
        return 0;
    }
    if ( fDual )
        pTemp = Gia_ManDemiterToDual( pAbc->pGia );
    else
        pTemp = Gia_ManDupDemiter( pAbc->pGia, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    if ( fVerbose )
        Gia_ManPrintStatsMiter( pTemp, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: &demiter [-ftdvh]\n" );
    Abc_Print( -2, "\t         decomposes a miter (by default, tries to extract an OR gate)\n" );
    Abc_Print( -2, "\t-f     : write files with two sides of a dual-output miter [default = %s]\n",  fDumpFiles? "yes": "no" );
    Abc_Print( -2, "\t-t     : write files with two sides of a two-word miter [default = %s]\n",  fDumpFilesTwo? "yes": "no" );
    Abc_Print( -2, "\t-d     : take single-output and decompose into dual-output [default = %s]\n",  fDual? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}